

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool Fossilize::Hashing::compute_hash_compute_pipeline
               (StateRecorder *recorder,VkComputePipelineCreateInfo *create_info,Hash *out_hash)

{
  bool bVar1;
  VkPipelineCreateFlags2CreateInfo *pVVar2;
  VkPipelineCreateFlags2KHR VVar3;
  VkShaderModuleCreateInfo *create_info_00;
  VkPipelineShaderStageModuleIdentifierCreateInfoEXT *info;
  Hash HVar4;
  VkPipelineShaderStageModuleIdentifierCreateInfoEXT *identifier;
  VkShaderModuleCreateInfo *module;
  Hash hash;
  Hasher h;
  Hash *out_hash_local;
  VkComputePipelineCreateInfo *create_info_local;
  StateRecorder *recorder_local;
  
  if ((create_info->stage).pName == (char *)0x0) {
    recorder_local._7_1_ = false;
  }
  else {
    h.h = (Hash)out_hash;
    Hasher::Hasher((Hasher *)&hash);
    bVar1 = StateRecorder::get_hash_for_pipeline_layout
                      (recorder,create_info->layout,(Hash *)&module);
    if (bVar1) {
      Hasher::u64((Hasher *)&hash,(uint64_t)module);
      pVVar2 = find_pnext<VkPipelineCreateFlags2CreateInfo>
                         (VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO,create_info->pNext);
      if (pVVar2 == (VkPipelineCreateFlags2CreateInfo *)0x0) {
        VVar3 = normalize_pipeline_creation_flags((ulong)create_info->flags);
        Hasher::u32((Hasher *)&hash,(uint32_t)VVar3);
      }
      else {
        Hasher::u32((Hasher *)&hash,0);
      }
      if (((create_info->flags & 4) == 0) || (create_info->basePipelineHandle == (VkPipeline)0x0)) {
        Hasher::u32((Hasher *)&hash,0);
      }
      else {
        bVar1 = StateRecorder::get_hash_for_compute_pipeline_handle
                          (recorder,create_info->basePipelineHandle,(Hash *)&module);
        if (!bVar1) {
          return false;
        }
        Hasher::u64((Hasher *)&hash,(uint64_t)module);
        Hasher::s32((Hasher *)&hash,create_info->basePipelineIndex);
      }
      if ((create_info->stage).module == (VkShaderModule)0x0) {
        create_info_00 =
             find_pnext<VkShaderModuleCreateInfo>
                       (VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO,(create_info->stage).pNext);
        if (create_info_00 == (VkShaderModuleCreateInfo *)0x0) {
          info = find_pnext<VkPipelineShaderStageModuleIdentifierCreateInfoEXT>
                           (VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_MODULE_IDENTIFIER_CREATE_INFO_EXT
                            ,(create_info->stage).pNext);
          if (info == (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)0x0) {
            return false;
          }
          bVar1 = StateRecorder::get_hash_for_shader_module(recorder,info,(Hash *)&module);
          if (!bVar1) {
            return false;
          }
        }
        else {
          bVar1 = compute_hash_shader_module(create_info_00,(Hash *)&module);
          if (!bVar1) {
            return false;
          }
        }
      }
      else {
        bVar1 = StateRecorder::get_hash_for_shader_module
                          (recorder,(create_info->stage).module,(Hash *)&module);
        if (!bVar1) {
          return false;
        }
      }
      Hasher::u64((Hasher *)&hash,(uint64_t)module);
      Hasher::string((Hasher *)&hash,(create_info->stage).pName);
      Hasher::u32((Hasher *)&hash,(create_info->stage).flags);
      Hasher::u32((Hasher *)&hash,(create_info->stage).stage);
      if ((create_info->stage).pSpecializationInfo == (VkSpecializationInfo *)0x0) {
        Hasher::u32((Hasher *)&hash,0);
      }
      else {
        hash_specialization_info((Hasher *)&hash,(create_info->stage).pSpecializationInfo);
      }
      bVar1 = hash_pnext_chain(recorder,(Hasher *)&hash,(create_info->stage).pNext,
                               (DynamicStateInfo *)0x0,0);
      if (bVar1) {
        bVar1 = hash_pnext_chain(recorder,(Hasher *)&hash,create_info->pNext,(DynamicStateInfo *)0x0
                                 ,0);
        if (bVar1) {
          HVar4 = Hasher::get((Hasher *)&hash);
          *(Hash *)h.h = HVar4;
          recorder_local._7_1_ = true;
        }
        else {
          recorder_local._7_1_ = false;
        }
      }
      else {
        recorder_local._7_1_ = false;
      }
    }
    else {
      recorder_local._7_1_ = false;
    }
  }
  return recorder_local._7_1_;
}

Assistant:

bool compute_hash_compute_pipeline(const StateRecorder &recorder, const VkComputePipelineCreateInfo &create_info, Hash *out_hash)
{
	// Ignore pipelines that cannot result in meaningful replay.
	if (!create_info.stage.pName)
		return false;

	Hasher h;
	Hash hash;

	if (!recorder.get_hash_for_pipeline_layout(create_info.layout, &hash))
		return false;
	h.u64(hash);

	if (find_pnext<VkPipelineCreateFlags2CreateInfoKHR>(VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO_KHR, create_info.pNext))
		h.u32(0);
	else
		h.u32(normalize_pipeline_creation_flags(create_info.flags));

	if ((create_info.flags & VK_PIPELINE_CREATE_DERIVATIVE_BIT) != 0 &&
	    create_info.basePipelineHandle != VK_NULL_HANDLE)
	{
		if (!recorder.get_hash_for_compute_pipeline_handle(create_info.basePipelineHandle, &hash))
			return false;
		h.u64(hash);
		h.s32(create_info.basePipelineIndex);
	}
	else
		h.u32(0);

	// Unfortunately, the hash order is incompatible with compute_hash_stage().
	// For compatibility, cannot change this without a clean break.
	if (create_info.stage.module != VK_NULL_HANDLE)
	{
		if (!recorder.get_hash_for_shader_module(create_info.stage.module, &hash))
			return false;
	}
	else if (const auto *module = find_pnext<VkShaderModuleCreateInfo>(
			VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO, create_info.stage.pNext))
	{
		if (!compute_hash_shader_module(*module, &hash))
			return false;
	}
	else if (const auto *identifier = find_pnext<VkPipelineShaderStageModuleIdentifierCreateInfoEXT>(
			VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_MODULE_IDENTIFIER_CREATE_INFO_EXT, create_info.stage.pNext))
	{
		if (!recorder.get_hash_for_shader_module(identifier, &hash))
			return false;
	}
	else
		return false;

	h.u64(hash);

	h.string(create_info.stage.pName);
	h.u32(create_info.stage.flags);
	h.u32(create_info.stage.stage);

	if (create_info.stage.pSpecializationInfo)
		hash_specialization_info(h, *create_info.stage.pSpecializationInfo);
	else
		h.u32(0);

	if (!hash_pnext_chain(&recorder, h, create_info.stage.pNext, nullptr, 0))
		return false;

	if (!hash_pnext_chain(&recorder, h, create_info.pNext, nullptr, 0))
		return false;

	*out_hash = h.get();
	return true;
}